

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blake2s_prov.c
# Opt level: O0

void ossl_blake2s_param_init(BLAKE2S_PARAM *P)

{
  undefined1 *in_RDI;
  
  *in_RDI = 0x20;
  in_RDI[1] = 0;
  in_RDI[2] = 1;
  in_RDI[3] = 1;
  store32(in_RDI + 4,0);
  store48(in_RDI + 8,0);
  in_RDI[0xe] = 0;
  in_RDI[0xf] = 0;
  memset(in_RDI + 0x10,0,8);
  memset(in_RDI + 0x18,0,8);
  return;
}

Assistant:

void ossl_blake2s_param_init(BLAKE2S_PARAM *P)
{
    P->digest_length = BLAKE2S_DIGEST_LENGTH;
    P->key_length    = 0;
    P->fanout        = 1;
    P->depth         = 1;
    store32(P->leaf_length, 0);
    store48(P->node_offset, 0);
    P->node_depth    = 0;
    P->inner_length  = 0;
    memset(P->salt,     0, sizeof(P->salt));
    memset(P->personal, 0, sizeof(P->personal));
}